

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O0

tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::FieldRef<Fixpp::TagT<455U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
* __thiscall
meta::impl::
tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::FieldRef<Fixpp::TagT<455u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<456u,Fixpp::Type::String>>>
::operator=(tuple_base<std::integer_sequence<unsigned_long,0ul,1ul>,Fixpp::FieldRef<Fixpp::TagT<455u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<456u,Fixpp::Type::String>>>
            *this,tuple<Fixpp::FieldRef<Fixpp::TagT<455U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
                  *v)

{
  type_by_index_t<0UL,_Fixpp::FieldRef<Fixpp::TagT<455U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
  *v_00;
  type_by_index_t<1UL,_Fixpp::FieldRef<Fixpp::TagT<455U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
  *v_01;
  tuple<Fixpp::FieldRef<Fixpp::TagT<455U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
  *v_local;
  tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::FieldRef<Fixpp::TagT<455U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
  *this_local;
  
  v_00 = get<0ul,Fixpp::FieldRef<Fixpp::TagT<455u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<456u,Fixpp::Type::String>>>
                   (v);
  tuple_value<0ul,Fixpp::FieldRef<Fixpp::TagT<455u,Fixpp::Type::String>>,false>::operator=
            ((tuple_value<0ul,Fixpp::FieldRef<Fixpp::TagT<455u,Fixpp::Type::String>>,false> *)this,
             v_00);
  v_01 = get<1ul,Fixpp::FieldRef<Fixpp::TagT<455u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<456u,Fixpp::Type::String>>>
                   (v);
  tuple_value<1ul,Fixpp::FieldRef<Fixpp::TagT<456u,Fixpp::Type::String>>,false>::operator=
            ((tuple_value<1ul,Fixpp::FieldRef<Fixpp::TagT<456u,Fixpp::Type::String>>,false> *)
             (this + 0x10),v_01);
  return (tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::FieldRef<Fixpp::TagT<455U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<456U,_Fixpp::Type::String>_>_>
          *)this;
}

Assistant:

tuple_base& operator=( const tuple< Us... >& v )
        noexcept( seq::is_all< std::is_nothrow_assignable< Ts&, const Us& >::value... >::value )
      {
#ifdef FIXPP_META_FOLD_EXPRESSIONS
        ( tuple_value< Is, Ts >::operator=( get< Is >( v ) ), ... );
#else
        (void)swallow{ ( tuple_value< Is, Ts >::operator=( meta::get< Is >( v ) ), true )..., true };
#endif
        return *this;
      }